

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

int tcp_listener_get_port(void *arg,void *buf,size_t *szp,nni_type t)

{
  uint8_t *paddr;
  size_t sStack_c8;
  int port;
  size_t sz;
  nng_sockaddr sa;
  tcp_listener *l;
  size_t *psStack_28;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  sStack_c8 = 0x88;
  sa.s_storage.sa_pad[0xf] = (uint64_t)arg;
  l._4_4_ = t;
  psStack_28 = szp;
  szp_local = (size_t *)buf;
  buf_local = arg;
  tcp_listener_get_locaddr(arg,&sz,&stack0xffffffffffffff38,NNI_TYPE_SOCKADDR);
  if (((short)sz == 3) || ((short)sz == 4)) {
    arg_local._4_4_ =
         nni_copyout_int((uint)sz._2_1_ * 0x100 + (uint)sz._3_1_,szp_local,psStack_28,l._4_4_);
  }
  else {
    arg_local._4_4_ = 0xb;
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcp_listener_get_port(void *arg, void *buf, size_t *szp, nni_type t)
{
	tcp_listener *l = arg;
	nng_sockaddr  sa;
	size_t        sz;
	int           port;
	uint8_t      *paddr;

	sz = sizeof(sa);
	(void) tcp_listener_get_locaddr(l, &sa, &sz, NNI_TYPE_SOCKADDR);

	switch (sa.s_family) {
	case NNG_AF_INET:
		paddr = (void *) &sa.s_in.sa_port;
		break;

	case NNG_AF_INET6:
		paddr = (void *) &sa.s_in6.sa_port;
		break;

	default:
		return (NNG_ESTATE);
	}

	NNI_GET16(paddr, port);
	return (nni_copyout_int(port, buf, szp, t));
}